

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3UpsertAnalyzeTarget(Parse *pParse,SrcList *pTabList,Upsert *pUpsert)

{
  int iTab;
  Table *pTVar1;
  ExprList *pEVar2;
  Expr *pEVar3;
  long lVar4;
  anon_union_8_2_443a03b8_for_u aVar5;
  int iVar6;
  uint uVar7;
  anon_union_8_2_443a03b8_for_u local_130;
  Expr *pExpr;
  int local_120;
  int nn;
  int jj;
  int ii;
  Expr sCol [2];
  NameContext sNC;
  Expr *pTerm;
  ExprList *pTarget;
  Index *pIdx;
  int iCursor;
  int rc;
  Table *pTab;
  Upsert *pUpsert_local;
  SrcList *pTabList_local;
  Parse *pParse_local;
  
  memset(&sCol[1].y,0,0x38);
  sCol[1].y = (anon_union_8_3_c79b3df9_for_y)pParse;
  pParse_local._4_4_ =
       sqlite3ResolveExprListNames((NameContext *)&sCol[1].y.sub,pUpsert->pUpsertTarget);
  if ((pParse_local._4_4_ == 0) &&
     (pParse_local._4_4_ =
           sqlite3ResolveExprNames((NameContext *)&sCol[1].y.sub,pUpsert->pUpsertTargetWhere),
     pParse_local._4_4_ == 0)) {
    pTVar1 = pTabList->a[0].pTab;
    pEVar2 = pUpsert->pUpsertTarget;
    iTab = pTabList->a[0].iCursor;
    if (((pTVar1->tabFlags & 0x20) == 0) &&
       (((pEVar2->nExpr == 1 && (pEVar3 = pEVar2->a[0].pExpr, pEVar3->op == 0xa2)) &&
        (pEVar3->iColumn == -1)))) {
      pParse_local._4_4_ = 0;
    }
    else {
      memset(&jj,0,0x90);
      jj._0_1_ = 0x6a;
      sCol[0].u.zToken = (char *)&sCol[0].y;
      sCol[0].y.sub.iAddr._0_1_ = 0xa2;
      sCol[1].x._4_4_ = pTabList->a[0].iCursor;
      for (pTarget = (ExprList *)pTVar1->pIndex; pTarget != (ExprList *)0x0;
          pTarget = *(ExprList **)(pTarget + 1)) {
        if (((*(char *)((long)&pTarget[2].a[0].zName + 2) != '\0') &&
            (pEVar2->nExpr == (uint)*(ushort *)((long)&pTarget[2].a[0].pExpr + 6))) &&
           ((lVar4._0_1_ = pTarget[1].a[0].sortOrder,
            lVar4._1_3_ = *(undefined3 *)&pTarget[1].a[0].field_0x19,
            lVar4._4_4_ = pTarget[1].a[0].u, lVar4 == 0 ||
            ((pUpsert->pUpsertTargetWhere != (Expr *)0x0 &&
             (iVar6 = sqlite3ExprCompare(pParse,pUpsert->pUpsertTargetWhere,
                                         *(Expr **)&pTarget[1].a[0].sortOrder,iTab), iVar6 == 0)))))
           ) {
          uVar7 = (uint)*(ushort *)((long)&pTarget[2].a[0].pExpr + 6);
          for (nn = 0; nn < (int)uVar7; nn = nn + 1) {
            sCol[0]._0_8_ = *(undefined8 *)(pTarget[1].a[0].zSpan + (long)nn * 8);
            if (*(short *)(&(pTarget->a[0].pExpr)->op + (long)nn * 2) == -2) {
              aVar5 = (anon_union_8_2_443a03b8_for_u)
                      ((anon_union_8_2_443a03b8_for_u *)
                      (*(long *)(pTarget + 2) + 8 + (long)nn * 0x20))->zToken;
              local_130 = aVar5;
              if (*aVar5.zToken != 'j') {
                local_130.zToken = (char *)&jj;
                sCol[0].u = aVar5;
              }
            }
            else {
              sCol[1].nHeight._0_2_ = *(undefined2 *)(&(pTarget->a[0].pExpr)->op + (long)nn * 2);
              local_130.zToken = (char *)&jj;
              sCol[0].u = (anon_union_8_2_443a03b8_for_u)&sCol[0].y;
            }
            local_120 = 0;
            while ((local_120 < (int)uVar7 &&
                   (iVar6 = sqlite3ExprCompare(pParse,pEVar2->a[local_120].pExpr,local_130,iTab),
                   1 < iVar6))) {
              local_120 = local_120 + 1;
            }
            if ((int)uVar7 <= local_120) break;
          }
          if ((int)uVar7 <= nn) {
            pUpsert->pUpsertIdx = (Index *)pTarget;
            return 0;
          }
        }
      }
      sqlite3ErrorMsg(pParse,
                      "ON CONFLICT clause does not match any PRIMARY KEY or UNIQUE constraint");
      pParse_local._4_4_ = 1;
    }
  }
  return pParse_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3UpsertAnalyzeTarget(
  Parse *pParse,     /* The parsing context */
  SrcList *pTabList, /* Table into which we are inserting */
  Upsert *pUpsert    /* The ON CONFLICT clauses */
){
  Table *pTab;            /* That table into which we are inserting */
  int rc;                 /* Result code */
  int iCursor;            /* Cursor used by pTab */
  Index *pIdx;            /* One of the indexes of pTab */
  ExprList *pTarget;      /* The conflict-target clause */
  Expr *pTerm;            /* One term of the conflict-target clause */
  NameContext sNC;        /* Context for resolving symbolic names */
  Expr sCol[2];           /* Index column converted into an Expr */

  assert( pTabList->nSrc==1 );
  assert( pTabList->a[0].pTab!=0 );
  assert( pUpsert!=0 );
  assert( pUpsert->pUpsertTarget!=0 );

  /* Resolve all symbolic names in the conflict-target clause, which
  ** includes both the list of columns and the optional partial-index
  ** WHERE clause.
  */
  memset(&sNC, 0, sizeof(sNC));
  sNC.pParse = pParse;
  sNC.pSrcList = pTabList;
  rc = sqlite3ResolveExprListNames(&sNC, pUpsert->pUpsertTarget);
  if( rc ) return rc;
  rc = sqlite3ResolveExprNames(&sNC, pUpsert->pUpsertTargetWhere);
  if( rc ) return rc;

  /* Check to see if the conflict target matches the rowid. */  
  pTab = pTabList->a[0].pTab;
  pTarget = pUpsert->pUpsertTarget;
  iCursor = pTabList->a[0].iCursor;
  if( HasRowid(pTab) 
   && pTarget->nExpr==1
   && (pTerm = pTarget->a[0].pExpr)->op==TK_COLUMN
   && pTerm->iColumn==XN_ROWID
  ){
    /* The conflict-target is the rowid of the primary table */
    assert( pUpsert->pUpsertIdx==0 );
    return SQLITE_OK;
  }

  /* Initialize sCol[0..1] to be an expression parse tree for a
  ** single column of an index.  The sCol[0] node will be the TK_COLLATE
  ** operator and sCol[1] will be the TK_COLUMN operator.  Code below
  ** will populate the specific collation and column number values
  ** prior to comparing against the conflict-target expression.
  */
  memset(sCol, 0, sizeof(sCol));
  sCol[0].op = TK_COLLATE;
  sCol[0].pLeft = &sCol[1];
  sCol[1].op = TK_COLUMN;
  sCol[1].iTable = pTabList->a[0].iCursor;

  /* Check for matches against other indexes */
  for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
    int ii, jj, nn;
    if( !IsUniqueIndex(pIdx) ) continue;
    if( pTarget->nExpr!=pIdx->nKeyCol ) continue;
    if( pIdx->pPartIdxWhere ){
      if( pUpsert->pUpsertTargetWhere==0 ) continue;
      if( sqlite3ExprCompare(pParse, pUpsert->pUpsertTargetWhere,
                             pIdx->pPartIdxWhere, iCursor)!=0 ){
        continue;
      }
    }
    nn = pIdx->nKeyCol;
    for(ii=0; ii<nn; ii++){
      Expr *pExpr;
      sCol[0].u.zToken = (char*)pIdx->azColl[ii];
      if( pIdx->aiColumn[ii]==XN_EXPR ){
        assert( pIdx->aColExpr!=0 );
        assert( pIdx->aColExpr->nExpr>ii );
        pExpr = pIdx->aColExpr->a[ii].pExpr;
        if( pExpr->op!=TK_COLLATE ){
          sCol[0].pLeft = pExpr;
          pExpr = &sCol[0];
        }
      }else{
        sCol[0].pLeft = &sCol[1];
        sCol[1].iColumn = pIdx->aiColumn[ii];
        pExpr = &sCol[0];
      }
      for(jj=0; jj<nn; jj++){
        if( sqlite3ExprCompare(pParse, pTarget->a[jj].pExpr, pExpr,iCursor)<2 ){
          break;  /* Column ii of the index matches column jj of target */
        }
      }
      if( jj>=nn ){
        /* The target contains no match for column jj of the index */
        break;
      }
    }
    if( ii<nn ){
      /* Column ii of the index did not match any term of the conflict target.
      ** Continue the search with the next index. */
      continue;
    }
    pUpsert->pUpsertIdx = pIdx;
    return SQLITE_OK;
  }
  sqlite3ErrorMsg(pParse, "ON CONFLICT clause does not match any "
                          "PRIMARY KEY or UNIQUE constraint");
  return SQLITE_ERROR;
}